

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O2

unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true> __thiscall
duckdb::ExtraDropInfo::Deserialize(ExtraDropInfo *this,Deserializer *deserializer)

{
  ExtraDropInfoType EVar1;
  SerializationException *this_00;
  allocator local_41;
  string local_40;
  
  EVar1 = Deserializer::ReadProperty<duckdb::ExtraDropInfoType>(deserializer,100,"info_type");
  this->_vptr_ExtraDropInfo = (_func_int **)0x0;
  if (EVar1 == SECRET_INFO) {
    ExtraDropSecretInfo::Deserialize((ExtraDropSecretInfo *)&local_40,deserializer);
    this->_vptr_ExtraDropInfo = (_func_int **)local_40._M_dataplus._M_p;
    return (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)
           (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Unsupported type for deserialization of ExtraDropInfo!",&local_41)
  ;
  SerializationException::SerializationException(this_00,&local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ExtraDropInfo> ExtraDropInfo::Deserialize(Deserializer &deserializer) {
	auto info_type = deserializer.ReadProperty<ExtraDropInfoType>(100, "info_type");
	unique_ptr<ExtraDropInfo> result;
	switch (info_type) {
	case ExtraDropInfoType::SECRET_INFO:
		result = ExtraDropSecretInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraDropInfo!");
	}
	return result;
}